

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.h
# Opt level: O1

void __thiscall
r_exec::CInput::CInput(CInput *this,View *input,_Fact *abstraction,BindingMap *bindings)

{
  atomic_int_fast64_t *paVar1;
  ushort uVar2;
  uint64_t uVar3;
  
  (this->bindings).object = &bindings->super__Object;
  if (bindings != (BindingMap *)0x0) {
    LOCK();
    paVar1 = &(bindings->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (this->abstraction).object = (_Object *)abstraction;
  if (abstraction != (_Fact *)0x0) {
    LOCK();
    paVar1 = &(abstraction->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (this->input).object = (_Object *)input;
  if (input != (View *)0x0) {
    LOCK();
    paVar1 = &(input->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  this->injected = false;
  uVar2 = r_code::Atom::asIndex();
  uVar3 = r_code::Utils::GetTimestamp
                    ((Atom *)((long)(input->super_View).references + (ulong)uVar2 * 4 + 0x18));
  this->ijt = uVar3;
  return;
}

Assistant:

CInput(View *input, _Fact *abstraction, BindingMap *bindings): bindings(bindings), abstraction(abstraction), input(input), injected(false), ijt(input->get_ijt()) {}